

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmeticdecoder.cpp
# Opt level: O0

U8 __thiscall ArithmeticDecoder::readByte(ArithmeticDecoder *this)

{
  undefined4 *puVar1;
  uint uVar2;
  U32 sym;
  ArithmeticDecoder *this_local;
  
  uVar2 = this->length >> 8;
  this->length = uVar2;
  uVar2 = this->value / uVar2;
  this->value = this->value - this->length * uVar2;
  if (this->length < 0x1000000) {
    renorm_dec_interval(this);
  }
  if (0xff < uVar2) {
    puVar1 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar1 = 0x1267;
    __cxa_throw(puVar1,&int::typeinfo,0);
  }
  return (U8)uVar2;
}

Assistant:

U8 ArithmeticDecoder::readByte()
{
  U32 sym = value / (length >>= 8);            // decode symbol, change length
  value -= length * sym;                                    // update interval

  if (length < AC__MinLength) renorm_dec_interval();        // renormalization

  if (sym >= (1u<<8))
  {
    throw 4711;
  }

  return (U8)sym;
}